

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QRect __thiscall QAccessibleMdiSubWindow::rect(QAccessibleMdiSubWindow *this)

{
  long lVar1;
  bool bVar2;
  QObject *pQVar3;
  QPoint *pos_00;
  QSize this_00;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QPoint pos;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QRect *in_stack_ffffffffffffffb0;
  QWidget *atopLeft;
  QAccessibleWidget *in_stack_ffffffffffffffd8;
  undefined1 local_18 [16];
  undefined1 auVar5 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  atopLeft = in_RDI;
  mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4c4a);
  bVar2 = QWidget::isHidden((QWidget *)0x7e4c52);
  if (bVar2) {
    QRect::QRect(in_stack_ffffffffffffffb0);
  }
  else {
    mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4c71);
    pQVar3 = QObject::parent((QObject *)0x7e4c79);
    if (pQVar3 == (QObject *)0x0) {
      local_18 = (undefined1  [16])QAccessibleWidget::rect(in_stack_ffffffffffffffd8);
    }
    else {
      pos_00 = (QPoint *)mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4cab);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa8);
      QWidget::mapToGlobal(in_RDI,pos_00);
      mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4cdc);
      this_00 = QWidget::size((QWidget *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QRect::QRect((QRect *)this_00,(QPoint *)atopLeft,(QSize *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar4.x1.m_i = local_18._0_4_;
    auVar5._4_4_ = local_18._4_4_;
    QVar4.x2.m_i = local_18._8_4_;
    QVar4.y2.m_i = local_18._12_4_;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleMdiSubWindow::rect() const
{
    if (mdiSubWindow()->isHidden())
        return QRect();
    if (!mdiSubWindow()->parent())
        return QAccessibleWidget::rect();
    const QPoint pos = mdiSubWindow()->mapToGlobal(QPoint(0, 0));
    return QRect(pos, mdiSubWindow()->size());
}